

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_buffer.cpp
# Opt level: O3

void __thiscall
duckdb::VectorListBuffer::VectorListBuffer
          (VectorListBuffer *this,LogicalType *list_type,idx_t initial_capacity)

{
  LogicalType *other;
  _Head_base<0UL,_duckdb::Vector_*,_false> this_00;
  LogicalType LStack_38;
  
  VectorBuffer::VectorBuffer(&this->super_VectorBuffer,LIST_BUFFER);
  (this->super_VectorBuffer)._vptr_VectorBuffer = (_func_int **)&PTR__VectorListBuffer_024371e0;
  other = ListType::GetChildType(list_type);
  this_00._M_head_impl = (Vector *)operator_new(0x68);
  LogicalType::LogicalType(&LStack_38,other);
  Vector::Vector(this_00._M_head_impl,&LStack_38,initial_capacity);
  (this->child).super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
  super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl = this_00._M_head_impl;
  LogicalType::~LogicalType(&LStack_38);
  this->capacity = initial_capacity;
  this->size = 0;
  return;
}

Assistant:

VectorListBuffer::VectorListBuffer(const LogicalType &list_type, idx_t initial_capacity)
    : VectorBuffer(VectorBufferType::LIST_BUFFER),
      child(make_uniq<Vector>(ListType::GetChildType(list_type), initial_capacity)), capacity(initial_capacity) {
}